

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void vkt::anon_unknown_0::getImageUsageFromAttachmentReferences
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *attachmentImageUsage,
               AttachmentRefType refType,size_t count,AttachmentReference *references)

{
  deUint32 dVar1;
  reference pvVar2;
  uint local_38;
  VkImageUsageFlags usage;
  deUint32 attachment;
  size_t referenceNdx;
  AttachmentReference *references_local;
  size_t count_local;
  AttachmentRefType refType_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *attachmentImageUsage_local;
  
  for (_usage = 0; _usage < count; _usage = _usage + 1) {
    dVar1 = AttachmentReference::getAttachment(references + _usage);
    if (dVar1 != 0xffffffff) {
      switch(refType) {
      case ATTACHMENTREFTYPE_COLOR:
      case ATTACHMENTREFTYPE_RESOLVE:
        local_38 = 0x10;
        break;
      case ATTACHMENTREFTYPE_DEPTH_STENCIL:
        local_38 = 0x20;
        break;
      case ATTACHMENTREFTYPE_INPUT:
        local_38 = 0x80;
        break;
      default:
        local_38 = 0;
      }
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (attachmentImageUsage,(ulong)dVar1);
      *pvVar2 = local_38 | *pvVar2;
    }
  }
  return;
}

Assistant:

void getImageUsageFromAttachmentReferences(vector<VkImageUsageFlags>& attachmentImageUsage, AttachmentRefType refType, size_t count, const AttachmentReference* references)
{
	for (size_t referenceNdx = 0; referenceNdx < count; ++referenceNdx)
	{
		const deUint32 attachment = references[referenceNdx].getAttachment();

		if (attachment != VK_ATTACHMENT_UNUSED)
		{
			VkImageUsageFlags usage;

			switch (refType)
			{
				case ATTACHMENTREFTYPE_COLOR:
				case ATTACHMENTREFTYPE_RESOLVE:
					usage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT;
					break;

				case ATTACHMENTREFTYPE_DEPTH_STENCIL:
					usage = VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;
					break;

				case ATTACHMENTREFTYPE_INPUT:
					usage = VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;
					break;

				default:
					DE_FATAL("Unexpected attachment reference type");
					usage = 0;
					break;
			}

			attachmentImageUsage[attachment] |= usage;
		}
	}
}